

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<unsigned_long,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
          (unsigned_long *arg,char (*args) [2],char *args_1,char (*args_2) [2],unsigned_long *args_3
          ,char (*args_4) [2],char *args_5,char (*args_6) [2],unsigned_long *args_7,
          char (*args_8) [2],char *args_9,char (*args_10) [2],unsigned_long *args_11,
          char (*args_12) [2],char *args_13,char (*args_14) [2])

{
  char (*unaff_RBP) [2];
  undefined8 in_RDI;
  char (*in_R8) [2];
  char *in_R9;
  char *unaff_R15;
  unsigned_long *unaff_retaddr;
  char (*in_stack_00000008) [2];
  char *in_stack_00000010;
  char (*in_stack_00000018) [2];
  unsigned_long *in_stack_00000020;
  char (*in_stack_00000028) [2];
  char *in_stack_00000030;
  char (*in_stack_00000038) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000050;
  unsigned_long *in_stack_fffffffffffffed8;
  string local_a0 [32];
  string local_80 [8];
  char (*in_stack_ffffffffffffff88) [2];
  unsigned_long *in_stack_ffffffffffffff90;
  char (*in_stack_ffffffffffffff98) [2];
  
  StringBuilder<unsigned_long>(in_stack_fffffffffffffed8);
  StringBuilder<char[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038);
  std::operator+(in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}